

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O1

Trivia __thiscall
slang::parsing::Preprocessor::handleDefaultDecayTimeDirective(Preprocessor *this,Token directive)

{
  Token *pTVar1;
  TokenKind TVar2;
  Info *pIVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  int iVar7;
  DefaultDecayTimeDirectiveSyntax *syntax;
  Token TVar8;
  string_view sVar9;
  Token local_68;
  Token local_58;
  Token local_48;
  Trivia local_38;
  
  local_58.info = directive.info;
  local_58._0_8_ = directive._0_8_;
  checkOutsideDesignElement(this,directive);
  Token::Token(&local_68);
  if ((this->currentToken).info == (Info *)0x0) {
    TVar8 = nextProcessed(this);
    this->currentToken = TVar8;
  }
  pTVar1 = &this->currentToken;
  TVar2 = (this->currentToken).kind;
  if (TVar2 == Identifier) {
    if ((this->currentToken).info == (Info *)0x0) {
      TVar8 = nextProcessed(this);
      this->currentToken = TVar8;
    }
    local_48.kind = (this->currentToken).kind;
    local_48._2_1_ = (this->currentToken).field_0x2;
    local_48.numFlags.raw = (this->currentToken).numFlags.raw;
    local_48.rawLen = (this->currentToken).rawLen;
    local_48.info = (this->currentToken).info;
    sVar9 = Token::valueText(&local_48);
    if ((sVar9._M_len != 8) || (iVar7 = bcmp(sVar9._M_str,"infinite",8), iVar7 != 0))
    goto LAB_0028bea5;
  }
  else if ((TVar2 != RealLiteral) && (TVar2 != IntegerLiteral)) goto LAB_0028bea5;
  if ((this->currentToken).info == (Info *)0x0) {
    TVar8 = nextProcessed(this);
    this->currentToken = TVar8;
  }
  TVar8 = this->currentToken;
  uVar4 = pTVar1->field_0x2;
  NVar5.raw = (pTVar1->numFlags).raw;
  uVar6 = pTVar1->rawLen;
  pIVar3 = (this->currentToken).info;
  (this->lastConsumed).kind = pTVar1->kind;
  (this->lastConsumed).field_0x2 = uVar4;
  (this->lastConsumed).numFlags = (NumericTokenFlags)NVar5.raw;
  (this->lastConsumed).rawLen = uVar6;
  (this->lastConsumed).info = pIVar3;
  Token::Token(&local_48);
  pTVar1->kind = local_48.kind;
  pTVar1->field_0x2 = local_48._2_1_;
  pTVar1->numFlags = (NumericTokenFlags)local_48.numFlags.raw;
  pTVar1->rawLen = local_48.rawLen;
  (this->currentToken).info = local_48.info;
  local_68 = TVar8;
LAB_0028bea5:
  if (local_68.info == (Info *)0x0) {
    local_68 = expect(this,IntegerLiteral);
  }
  syntax = BumpAllocator::
           emplace<slang::syntax::DefaultDecayTimeDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&>
                     (this->alloc,&local_58,&local_68);
  Trivia::Trivia(&local_38,Directive,(SyntaxNode *)syntax);
  return local_38;
}

Assistant:

Trivia Preprocessor::handleDefaultDecayTimeDirective(Token directive) {
    checkOutsideDesignElement(directive);

    Token time;
    switch (peek().kind) {
        case TokenKind::IntegerLiteral:
        case TokenKind::RealLiteral:
            time = consume();
            break;
        case TokenKind::Identifier:
            if (peek().valueText() == "infinite")
                time = consume();
            break;
        default:
            break;
    }

    if (!time)
        time = expect(TokenKind::IntegerLiteral);

    auto result = alloc.emplace<DefaultDecayTimeDirectiveSyntax>(directive, time);
    return Trivia(TriviaKind::Directive, result);
}